

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::gamma_dist<long_double>::pdf(gamma_dist<long_double> *this,result_type_conflict3 x)

{
  param_type *in_RSI;
  result_type_conflict3 *in_RDI;
  longdouble in_ST0;
  unkbyte10 in_ST3;
  double __x;
  longdouble in_stack_00000008;
  undefined8 in_stack_ffffffffffffff92;
  
  if ((longdouble)0 <= in_stack_00000008) {
    param_type::theta(in_RDI,in_RSI);
    param_type::kappa(in_RDI,in_RSI);
    math::ln((longdouble)
             CONCAT82(in_stack_ffffffffffffff92,
                      (short)((unkuint10)(in_stack_00000008 / in_ST0) >> 0x40)));
    param_type::kappa(in_RDI,in_RSI);
    math::ln_Gamma((longdouble)
                   CONCAT82(in_stack_ffffffffffffff92,(short)((unkuint10)in_ST3 >> 0x40)));
    std::exp(__x);
    in_RDI = param_type::theta(in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

pdf(result_type x) const {
      if (x < 0)
        return 0;
      x /= P.theta();
      return math::exp((P.kappa() - 1) * math::ln(x) - x - math::ln_Gamma(P.kappa())) /
             (P.theta());
    }